

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,deInt32 srcSize,Vec3 *sq)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (mode < LODMODE_LAST) {
    fVar2 = ((sq->m_data[1] - sq->m_data[0]) * (float)srcSize) / (float)dstSize->m_data[1];
    fVar3 = ((sq->m_data[2] - sq->m_data[0]) * (float)srcSize) / (float)dstSize->m_data[0];
    uVar1 = -(uint)(-fVar3 <= fVar3);
    fVar3 = (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1);
    uVar1 = -(uint)(-fVar2 <= fVar2);
    fVar2 = (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1);
    uVar1 = -(uint)(fVar2 <= fVar3);
    fVar3 = (float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar3);
  }
  fVar3 = logf(fVar3);
  return fVar3 * 1.442695;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, deInt32 srcSize, const tcu::Vec3& sq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize;
	float duy	= (sq.y() - sq.x()) * (float)srcSize;
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, duy/dy);
}